

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O0

void bug(char *fmt,...)

{
  int i;
  t_int arg [8];
  va_list ap;
  char local_3f8 [8];
  char buf [1000];
  char *fmt_local;
  
  arg[7]._4_4_ = 0x30;
  arg[7]._0_4_ = 8;
  buf._992_8_ = fmt;
  vsnprintf(local_3f8,999,fmt,arg + 7);
  pd_error((void *)0x0,"consistency check failed: %s",local_3f8);
  return;
}

Assistant:

void bug(const char *fmt, ...)
{
    char buf[MAXPDSTRING];
    va_list ap;
    t_int arg[8];
    int i;
    va_start(ap, fmt);
    vsnprintf(buf, MAXPDSTRING-1, fmt, ap);
    va_end(ap);

    pd_error(0, "consistency check failed: %s", buf);
}